

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> *
smf::MidiMessage::intToVlv
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,int value)

{
  pointer *ppuVar1;
  iterator iVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  uchar byte5;
  uchar byte1;
  byte local_2e;
  byte local_2d;
  byte local_2c;
  byte local_2b;
  byte local_2a;
  byte local_29;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_29 = (byte)value;
  if (value < 0x80) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (__return_storage_ptr__,(iterator)0x0,&local_29);
    return __return_storage_ptr__;
  }
  bVar5 = local_29 & 0x7f;
  bVar3 = (byte)((uint)value >> 7);
  local_2e = bVar3 & 0x7f;
  bVar4 = (byte)((uint)value >> 0xe);
  local_2d = bVar4 & 0x7f;
  bVar6 = (byte)((uint)value >> 0x15);
  local_2c = bVar6 & 0x7f;
  local_2b = (byte)((uint)value >> 0x1c);
  local_2a = bVar5;
  if ((uint)value < 0x10000000) {
    if (((uint)value >> 0x15 & 0x7f) != 0) goto LAB_0011d275;
    if (((uint)value >> 0xe & 0x7f) != 0) {
      local_2d = bVar4 | 0x80;
      local_2e = bVar3 | 0x80;
      goto LAB_0011d2c7;
    }
    if (((uint)value >> 7 & 0x7f) == 0) goto LAB_0011d307;
    local_2e = bVar3 | 0x80;
  }
  else {
    local_2c = bVar6 | 0x80;
LAB_0011d275:
    bVar6 = local_2c | 0x80;
    local_2d = bVar4 | 0x80;
    local_2e = bVar3 | 0x80;
    local_2c = bVar6;
    if (0xfffffff < (uint)value) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 (iterator)0x0,&local_2b);
    }
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,iVar2
                 ,&local_2c);
    }
    else {
      *iVar2._M_current = bVar6;
      ppuVar1 = &(__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
LAB_0011d2c7:
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,iVar2
                 ,&local_2d);
    }
    else {
      *iVar2._M_current = bVar4 | 0x80;
      ppuVar1 = &(__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
  }
  iVar2._M_current =
       (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_realloc_insert<unsigned_char_const&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,iVar2,
               &local_2e);
  }
  else {
    *iVar2._M_current = bVar3 | 0x80;
    ppuVar1 = &(__return_storage_ptr__->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
LAB_0011d307:
  iVar2._M_current =
       (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_realloc_insert<unsigned_char_const&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,iVar2,
               &local_2a);
  }
  else {
    *iVar2._M_current = bVar5;
    ppuVar1 = &(__return_storage_ptr__->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uchar> MidiMessage::intToVlv(int value) {
	std::vector<uchar> output;
	if (value < 128) {
		output.push_back((uchar)value);
	} else {
		// calculate VLV bytes and insert into message
		uchar byte1 = value & 0x7f;
		uchar byte2 = (value >>  7) & 0x7f;
		uchar byte3 = (value >> 14) & 0x7f;
		uchar byte4 = (value >> 21) & 0x7f;
		uchar byte5 = (value >> 28) & 0x7f;
		if (byte5) {
			byte4 |= 0x80;
		}
		if (byte4) {
			byte4 |= 0x80;
			byte3 |= 0x80;
		}
		if (byte3) {
			byte3 |= 0x80;
			byte2 |= 0x80;
		}
		if (byte2) {
			byte2 |= 0x80;
		}
		if (byte5) { output.push_back(byte5); }
		if (byte4) { output.push_back(byte4); }
		if (byte3) { output.push_back(byte3); }
		if (byte2) { output.push_back(byte2); }
		output.push_back(byte1);
	}

	return output;
}